

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O1

double __thiscall pfederc::Logger::log(Logger *this,double __x)

{
  string *in_RDX;
  Level in_SI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  if ((this->allowedLevels & in_SI) == in_SI) {
    if ((in_SI & (LVL_HELP|LVL_NOTE|LVL_WARNING)) == 0) {
      BaseLogger::error(&this->baseLog,in_RDX);
      __x = extraout_XMM0_Qa_00;
    }
    else {
      BaseLogger::info(&this->baseLog,in_RDX);
      __x = extraout_XMM0_Qa;
    }
  }
  return __x;
}

Assistant:

bool Logger::log(Level logLevel, const std::string &msg) noexcept {
  if (!accept(logLevel))
    return false;

  if ((logLevel & (LVL_WARNING | LVL_NOTE | LVL_HELP)) != 0)
    baseLog.info(msg);
  else
    baseLog.error(msg);

  return true;
}